

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall
mkvparser::Chapters::Atom::Parse(Atom *this,IMkvReader *pReader,longlong pos,longlong size)

{
  long stop;
  bool bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long unaff_R15;
  longlong val;
  longlong size_1;
  longlong id;
  longlong local_58;
  Atom *local_50;
  unsigned_long_long local_48;
  long local_40;
  long local_38;
  
  stop = size + pos;
  if (0 < size) {
    local_58 = pos;
    local_50 = this;
    do {
      lVar4 = ParseElementHeader(pReader,&local_58,stop,&local_38,&local_40);
      lVar3 = local_40;
      bVar1 = true;
      if (-1 < lVar4) {
        if (local_40 == 0) {
          bVar1 = false;
          lVar4 = unaff_R15;
        }
        else {
          lVar2 = unaff_R15;
          if (local_38 < 0x92) {
            if (local_38 == 0x80) {
              lVar5 = ParseDisplay(local_50,pReader,local_58,local_40);
              lVar4 = lVar5;
              goto joined_r0x001601cf;
            }
            if (local_38 == 0x91) {
              lVar5 = UnserializeUInt(pReader,local_58,local_40);
              lVar4 = lVar5;
              lVar2 = lVar5;
              if (-1 < lVar5) {
                local_50->m_start_timecode = lVar5;
                lVar4 = unaff_R15;
                lVar2 = unaff_R15;
              }
              goto joined_r0x001601cf;
            }
          }
          else {
            if (local_38 == 0x92) {
              lVar5 = UnserializeUInt(pReader,local_58,local_40);
              lVar4 = lVar5;
              lVar2 = lVar5;
              if (-1 < lVar5) {
                local_50->m_stop_timecode = lVar5;
                lVar4 = unaff_R15;
                lVar2 = unaff_R15;
              }
            }
            else if (local_38 == 0x5654) {
              lVar5 = UnserializeString(pReader,local_58,local_40,&local_50->m_string_uid);
              lVar4 = lVar5;
            }
            else {
              if (local_38 != 0x73c4) goto LAB_001601d1;
              lVar5 = UnserializeInt(pReader,local_58,local_40,(longlong *)&local_48);
              lVar4 = lVar5;
              lVar2 = lVar5;
              if (-1 < lVar5) {
                local_50->m_uid = local_48;
                lVar4 = unaff_R15;
                lVar2 = unaff_R15;
              }
            }
joined_r0x001601cf:
            unaff_R15 = lVar2;
            if (lVar5 < 0) goto LAB_001601f3;
          }
LAB_001601d1:
          lVar4 = unaff_R15;
          local_58 = lVar3 + local_58;
          bVar1 = stop < local_58;
          if (stop < local_58) {
            lVar4 = -2;
          }
        }
      }
LAB_001601f3:
      if (bVar1) {
        return lVar4;
      }
      pos = local_58;
      unaff_R15 = lVar4;
    } while (local_58 < stop);
  }
  return (ulong)(pos == stop) * 2 + -2;
}

Assistant:

long Chapters::Atom::Parse(IMkvReader* pReader, long long pos, long long size) {
  const long long stop = pos + size;

  while (pos < stop) {
    long long id, size;

    long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (size == 0)  // 0 length payload, skip.
      continue;

    if (id == libwebm::kMkvChapterDisplay) {
      status = ParseDisplay(pReader, pos, size);

      if (status < 0)  // error
        return status;
    } else if (id == libwebm::kMkvChapterStringUID) {
      status = UnserializeString(pReader, pos, size, m_string_uid);

      if (status < 0)  // error
        return status;
    } else if (id == libwebm::kMkvChapterUID) {
      long long val;
      status = UnserializeInt(pReader, pos, size, val);

      if (status < 0)  // error
        return status;

      m_uid = static_cast<unsigned long long>(val);
    } else if (id == libwebm::kMkvChapterTimeStart) {
      const long long val = UnserializeUInt(pReader, pos, size);

      if (val < 0)  // error
        return static_cast<long>(val);

      m_start_timecode = val;
    } else if (id == libwebm::kMkvChapterTimeEnd) {
      const long long val = UnserializeUInt(pReader, pos, size);

      if (val < 0)  // error
        return static_cast<long>(val);

      m_stop_timecode = val;
    }

    pos += size;
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;
  return 0;
}